

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O0

void __thiscall Peeps::PeepFunc(Peeps *this)

{
  Instr *pIVar1;
  code *pcVar2;
  bool bVar3;
  IRKind IVar4;
  RegNum RVar5;
  bool bVar6;
  IRType type;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  BOOL BVar10;
  LabelInstr *instrNext_00;
  undefined4 *puVar11;
  BranchInstr *pBVar12;
  Opnd *pOVar13;
  RegOpnd *pRVar14;
  Instr *pIVar15;
  IntConstOpnd *pIVar16;
  Opnd *pOVar17;
  LabelInstr *pLVar18;
  ulong uVar19;
  Opnd *src2Opnd;
  bool local_149;
  LabelInstr *local_148;
  bool local_131;
  bool local_121;
  bool local_111;
  bool local_f9;
  Instr *xorps;
  Opnd *dst_2;
  Opnd *dst_1;
  Instr *addOrSubInstr;
  IntConstOpnd *constOne;
  Instr *nextInstr;
  Instr *prevInstr_1;
  bool pattern_found;
  Opnd *dst;
  LabelInstr *target;
  BranchInstr *branchInstr;
  LabelInstr *peepCondMoveLabel;
  Instr *branchNextAfterPeep;
  Instr *branchNext;
  BranchInstr *pBStack_68;
  bool peeped_1;
  BranchInstr *branch;
  Instr *prevInstr;
  LabelInstr *pLStack_50;
  bool peeped;
  Instr *instr;
  Instr *instrStop;
  Instr *instrNext;
  bool isInHelper;
  Peeps *pPStack_30;
  bool peepsEnabled;
  Peeps *this_local;
  Instr *local_20;
  Instr *local_18;
  Instr *local_10;
  
  instrNext._7_1_ = 1;
  pPStack_30 = this;
  uVar8 = Func::GetSourceContextId(this->func);
  uVar9 = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,PeepsPhase,uVar8,uVar9);
  if (bVar3) {
    instrNext._7_1_ = 0;
  }
  AgenPeeps::PeepFunc(&this->peepsAgen);
  PeepsMD::Init(&this->peepsMD,this);
  memset(this->regMap,0,0x108);
  SymTable::ClearStackSymScratch(this->func->m_symTable);
  instrNext._6_1_ = 0;
  instr = (Instr *)0x0;
  pLStack_50 = (LabelInstr *)this->func->m_headInstr;
  do {
    if (pLStack_50 == (LabelInstr *)instr) {
      return;
    }
    instrStop = (pLStack_50->super_Instr).m_next;
    IVar4 = IR::Instr::GetKind(&pLStack_50->super_Instr);
    pIVar15 = instrStop;
    switch(IVar4) {
    case InstrKindBranch:
      if (((instrNext._7_1_ & 1) != 0) && ((pLStack_50->super_Instr).m_opcode != Leave)) {
        pBVar12 = IR::Instr::AsBranchInstr(&pLStack_50->super_Instr);
        pLVar18 = IR::BranchInstr::GetTarget(pBVar12);
        if ((pLVar18 == (LabelInstr *)0x0) ||
           (BVar10 = IR::LabelInstr::IsGeneratorEpilogueLabel(pLVar18), pIVar15 = instrStop,
           BVar10 == 0)) {
          instrStop = PeepBranch(pBVar12,(bool *)0x0);
          if ((instrStop == (Instr *)0x0) || (instrStop->m_prev == (Instr *)0x0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x7c,"(instrNext && instrNext->m_prev)",
                               "instrNext && instrNext->m_prev");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
          bVar3 = IR::Instr::IsBranchInstr(instrStop->m_prev);
          pIVar15 = instrStop;
          if (bVar3) {
            pBVar12 = IR::Instr::AsBranchInstr(instrStop->m_prev);
            pIVar15 = HoistSameInstructionAboveSplit(this,pBVar12,instrStop);
          }
        }
      }
      break;
    case InstrKindLabel:
    case InstrKindProfiledLabel:
      if ((instrNext._7_1_ & 1) != 0) {
        ClearRegMap(this);
        pLVar18 = IR::Instr::AsLabelInstr(&pLStack_50->super_Instr);
        BVar10 = IR::LabelInstr::IsUnreferenced(pLVar18);
        if (BVar10 == 0) {
          branch = (BranchInstr *)IR::Instr::GetPrevRealInstr(&pLStack_50->super_Instr);
          bVar3 = IR::Instr::IsBranchInstr((Instr *)branch);
          if (bVar3) {
            pBStack_68 = IR::Instr::AsBranchInstr(&branch->super_Instr);
            bVar3 = IR::BranchInstr::IsUnconditional(pBStack_68);
            if (((bVar3) && (bVar3 = IR::BranchInstr::IsMultiBranch(pBStack_68), !bVar3)) &&
               (pLVar18 = IR::BranchInstr::GetTarget(pBStack_68), pLVar18 == pLStack_50)) {
              pIVar1 = (pBStack_68->super_Instr).m_next;
              pIVar15 = PeepBranch(pBStack_68,(bool *)((long)&branchNext + 7));
              if (((branchNext._7_1_ & 1) != 0) || (pIVar15 != pIVar1)) break;
            }
          }
        }
        else {
          pLVar18 = IR::Instr::AsLabelInstr(&pLStack_50->super_Instr);
          instrStop = PeepUnreachableLabel
                                (pLVar18,(bool)(instrNext._6_1_ & 1),(bool *)((long)&prevInstr + 7))
          ;
          pIVar15 = instrStop;
          if ((prevInstr._7_1_ & 1) != 0) break;
        }
        pLVar18 = IR::Instr::AsLabelInstr(&pLStack_50->super_Instr);
        pIVar15 = instrStop;
        instrNext._6_1_ = ((byte)pLVar18->field_0x78 >> 1 & 1) != 0;
        local_10 = instrStop;
        IVar4 = IR::Instr::GetKind(instrStop);
        local_f9 = true;
        if (IVar4 != InstrKindLabel) {
          local_f9 = IR::Instr::IsProfiledLabelInstr(pIVar15);
        }
        if (local_f9 != false) {
          pLVar18 = IR::Instr::AsLabelInstr(&pLStack_50->super_Instr);
          instrNext_00 = IR::Instr::AsLabelInstr(instrStop);
          instrStop = CleanupLabel(pLVar18,instrNext_00);
        }
        pIVar15 = instrStop;
        local_18 = instrStop;
        IVar4 = IR::Instr::GetKind(instrStop);
        local_111 = true;
        if (IVar4 != InstrKindLabel) {
          local_111 = IR::Instr::IsProfiledLabelInstr(pIVar15);
        }
        if (local_111 == false) {
          pIVar15 = instrStop->m_prev;
          local_20 = pIVar15;
          IVar4 = IR::Instr::GetKind(pIVar15);
          local_121 = true;
          if (IVar4 != InstrKindLabel) {
            local_121 = IR::Instr::IsProfiledLabelInstr(pIVar15);
          }
          if (local_121 == false) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 1;
            bVar3 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x61,
                               "(instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr())",
                               "instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr()");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            puVar11 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar11 = 0;
          }
        }
        pIVar15 = instrStop;
        this_local = (Peeps *)instrStop;
        IVar4 = IR::Instr::GetKind(instrStop);
        local_131 = true;
        if (IVar4 != InstrKindLabel) {
          local_131 = IR::Instr::IsProfiledLabelInstr(pIVar15);
        }
        if (local_131 == false) {
          local_148 = IR::Instr::AsLabelInstr(instrStop->m_prev);
        }
        else {
          local_148 = IR::Instr::AsLabelInstr(instrStop);
        }
        local_149 = false;
        if ((instrNext._6_1_ & 1) != 0) {
          local_149 = ((byte)local_148->field_0x78 >> 1 & 1) != 0;
        }
        pIVar15 = PeepCondMove(this,local_148,instrStop,local_149);
      }
      break;
    default:
      bVar3 = LowererMD::IsAssign(&pLStack_50->super_Instr);
      pIVar15 = instrStop;
      if (bVar3) {
        if ((instrNext._7_1_ & 1) != 0) {
          pIVar15 = PeepAssign(this,&pLStack_50->super_Instr);
        }
      }
      else if ((((pLStack_50->super_Instr).m_opcode == ArgOut_A_InlineBuiltIn) ||
               ((pLStack_50->super_Instr).m_opcode == StartCall)) ||
              ((pLStack_50->super_Instr).m_opcode == LoweredStartCall)) {
        IR::Instr::Remove(&pLStack_50->super_Instr);
        pIVar15 = instrStop;
      }
      else if ((pLStack_50->super_Instr).m_opcode == MOVSD_ZERO) {
        PeepsMD::PeepAssign(&this->peepsMD,&pLStack_50->super_Instr);
        pOVar13 = IR::Instr::GetDst(&pLStack_50->super_Instr);
        pIVar15 = instrStop;
        if ((pOVar13 != (Opnd *)0x0) &&
           (bVar3 = IR::Opnd::IsRegOpnd(pOVar13), pIVar15 = instrStop, bVar3)) {
          pRVar14 = IR::Opnd::AsRegOpnd(pOVar13);
          RVar5 = IR::RegOpnd::GetReg(pRVar14);
          ClearReg(this,RVar5);
          pIVar15 = instrStop;
        }
      }
      else if (((pLStack_50->super_Instr).m_opcode == INC) ||
              ((pLStack_50->super_Instr).m_opcode == DEC)) {
        if ((instrNext._7_1_ & 1) != 0) {
          bVar3 = AutoSystemInfo::IsAtomPlatform(&AutoSystemInfo::Data);
          if (bVar3) {
LAB_00839007:
            bVar3 = false;
            bVar6 = IR::Instr::IsEntryInstr(&pLStack_50->super_Instr);
            if (!bVar6) {
              pIVar15 = IR::Instr::GetPrevRealInstr(&pLStack_50->super_Instr);
              bVar6 = IsJccOrShiftInstr(pIVar15);
              if (bVar6) {
                bVar3 = true;
              }
              else {
                bVar6 = IR::Instr::IsEntryInstr(pIVar15);
                if (!bVar6) {
                  pIVar15 = IR::Instr::GetPrevRealInstr(pIVar15);
                  bVar6 = IsJccOrShiftInstr(pIVar15);
                  if (bVar6) {
                    bVar3 = true;
                  }
                }
              }
            }
            if ((!bVar3) && (bVar6 = IR::Instr::IsExitInstr(&pLStack_50->super_Instr), !bVar6)) {
              pIVar15 = IR::Instr::GetNextRealInstr(&pLStack_50->super_Instr);
              bVar6 = IsJccOrShiftInstr(pIVar15);
              if (bVar6) {
                bVar3 = true;
              }
              else {
                bVar6 = IR::Instr::IsExitInstr(pIVar15);
                if (!bVar6) {
                  pIVar15 = IR::Instr::GetNextRealInstr(pIVar15);
                  bVar6 = IsJccOrShiftInstr(pIVar15);
                  if (bVar6) {
                    bVar3 = true;
                  }
                }
              }
            }
            if (bVar3) {
              pOVar13 = IR::Instr::GetDst(&pLStack_50->super_Instr);
              type = IR::Opnd::GetType(pOVar13);
              pIVar16 = IR::IntConstOpnd::New(1,type,(pLStack_50->super_Instr).m_func,false);
              pOVar13 = IR::Instr::GetDst(&pLStack_50->super_Instr);
              pOVar17 = IR::Instr::GetDst(&pLStack_50->super_Instr);
              pLVar18 = (LabelInstr *)
                        IR::Instr::New(ADD,pOVar13,pOVar17,&pIVar16->super_Opnd,
                                       (pLStack_50->super_Instr).m_func);
              if ((pLStack_50->super_Instr).m_opcode == DEC) {
                (pLVar18->super_Instr).m_opcode = SUB;
              }
              IR::Instr::InsertAfter(&pLStack_50->super_Instr,(Instr *)pLVar18);
              IR::Instr::Remove(&pLStack_50->super_Instr);
              pLStack_50 = pLVar18;
            }
          }
          else {
            uVar8 = Func::GetSourceContextId(this->func);
            uVar9 = Func::GetLocalFunctionId(this->func);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ea41a0,AtomPhase,uVar8,uVar9);
            if (bVar3) goto LAB_00839007;
          }
          pOVar13 = IR::Instr::GetDst(&pLStack_50->super_Instr);
          pIVar15 = instrStop;
          if ((pOVar13 != (Opnd *)0x0) &&
             (bVar3 = IR::Opnd::IsRegOpnd(pOVar13), pIVar15 = instrStop, bVar3)) {
            pRVar14 = IR::Opnd::AsRegOpnd(pOVar13);
            RVar5 = IR::RegOpnd::GetReg(pRVar14);
            ClearReg(this,RVar5);
            pIVar15 = instrStop;
          }
        }
      }
      else if ((instrNext._7_1_ & 1) != 0) {
        pLStack_50 = (LabelInstr *)PeepRedundant(this,&pLStack_50->super_Instr);
        pOVar13 = IR::Instr::GetDst((Instr *)pLStack_50);
        if ((pOVar13 != (Opnd *)0x0) && (bVar3 = IR::Opnd::IsRegOpnd(pOVar13), bVar3)) {
          pRVar14 = IR::Opnd::AsRegOpnd(pOVar13);
          RVar5 = IR::RegOpnd::GetReg(pRVar14);
          ClearReg(this,RVar5);
        }
        PeepsMD::ProcessImplicitRegs(&this->peepsMD,&pLStack_50->super_Instr);
        if ((pLStack_50->super_Instr).m_opcode == TEST) {
          pOVar13 = IR::Instr::GetSrc2(&pLStack_50->super_Instr);
          bVar3 = IR::Opnd::IsIntConstOpnd(pOVar13);
          if (bVar3) {
            pOVar13 = IR::Instr::GetSrc2(&pLStack_50->super_Instr);
            pIVar16 = IR::Opnd::AsIntConstOpnd(pOVar13);
            uVar19 = IR::EncodableOpnd<long>::GetValue(&pIVar16->super_EncodableOpnd<long>);
            if ((uVar19 & 0xffffff00) == 0) {
              pOVar13 = IR::Instr::GetSrc1(&pLStack_50->super_Instr);
              bVar3 = IR::Opnd::IsRegOpnd(pOVar13);
              if (bVar3) {
                pOVar13 = IR::Instr::GetSrc1(&pLStack_50->super_Instr);
                pRVar14 = IR::Opnd::AsRegOpnd(pOVar13);
                RVar5 = IR::RegOpnd::GetReg(pRVar14);
                bVar7 = LinearScan::GetRegAttribs(RVar5);
                if ((((bVar7 & 8) != 0) && (bVar3 = IR::Instr::IsBranchInstr(instrStop), bVar3)) &&
                   ((instrStop->m_opcode == JNE || (instrStop->m_opcode == JEQ)))) {
                  pOVar13 = IR::Instr::GetSrc1(&pLStack_50->super_Instr);
                  IR::Opnd::SetType(pOVar13,TyInt8);
                  pOVar13 = IR::Instr::GetSrc2(&pLStack_50->super_Instr);
                  IR::Opnd::SetType(pOVar13,TyInt8);
                }
              }
            }
          }
        }
        pIVar15 = instrStop;
        if ((pLStack_50->super_Instr).m_opcode == CVTSI2SD) {
          pOVar13 = IR::Instr::GetDst(&pLStack_50->super_Instr);
          pOVar17 = IR::Instr::GetDst(&pLStack_50->super_Instr);
          src2Opnd = IR::Instr::GetDst(&pLStack_50->super_Instr);
          pIVar15 = IR::Instr::New(XORPS,pOVar13,pOVar17,src2Opnd,(pLStack_50->super_Instr).m_func);
          IR::Instr::InsertBefore(&pLStack_50->super_Instr,pIVar15);
          pIVar15 = instrStop;
        }
      }
      break;
    case InstrKindPragma:
      if ((pLStack_50->super_Instr).m_opcode == Nop) {
        IR::Instr::Remove(&pLStack_50->super_Instr);
        pIVar15 = instrStop;
      }
    }
    instrStop = pIVar15;
    pLStack_50 = (LabelInstr *)instrStop;
  } while( true );
}

Assistant:

void
Peeps::PeepFunc()
{
    bool peepsEnabled = true;
    if (PHASE_OFF(Js::PeepsPhase, this->func))
    {
        peepsEnabled = false;
    }

#if defined(_M_IX86) || defined(_M_X64)
    // Agen dependency elimination pass
    // Since it can reveal load elimination opportunities for the normal peeps pass, we do it separately.
    this->peepsAgen.PeepFunc();
#endif

    this->peepsMD.Init(this);

    // Init regMap
    memset(this->regMap, 0, sizeof(this->regMap));

    // Scratch field needs to be cleared.
    this->func->m_symTable->ClearStackSymScratch();

    bool isInHelper = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        switch (instr->GetKind())
        {
        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
        {
            if (!peepsEnabled)
            {
                break;
            }
            // Don't carry any regMap info across label
            this->ClearRegMap();

            // Remove unreferenced labels
            if (instr->AsLabelInstr()->IsUnreferenced())
            {
                bool peeped;
                instrNext = PeepUnreachableLabel(instr->AsLabelInstr(), isInHelper, &peeped);
                if(peeped)
                {
                    continue;
                }
            }
            else
            {
                // Try to peep a previous branch again after dead label blocks are removed. For instance:
                //         jmp L2
                //     L3:
                //         // dead code
                //     L2:
                // L3 is unreferenced, so after that block is removed, the branch-to-next can be removed. After that, if L2 is
                // unreferenced and only has fallthrough, it can be removed as well.
                IR::Instr *const prevInstr = instr->GetPrevRealInstr();
                if(prevInstr->IsBranchInstr())
                {
                    IR::BranchInstr *const branch = prevInstr->AsBranchInstr();
                    if(branch->IsUnconditional() && !branch->IsMultiBranch() && branch->GetTarget() == instr)
                    {
                        bool peeped;
                        IR::Instr *const branchNext = branch->m_next;
                        IR::Instr *const branchNextAfterPeep = PeepBranch(branch, &peeped);
                        if(peeped || branchNextAfterPeep != branchNext)
                        {
                            // The peep did something, restart from after the branch
                            instrNext = branchNextAfterPeep;
                            continue;
                        }
                    }
                }
            }

            isInHelper = instr->AsLabelInstr()->isOpHelper;

            if (instrNext->IsLabelInstr())
            {
                // CLean up double label
                instrNext = this->CleanupLabel(instr->AsLabelInstr(), instrNext->AsLabelInstr());
            }

#if defined(_M_IX86) || defined(_M_X64)
            Assert(instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr());
            IR::LabelInstr *const peepCondMoveLabel =
                instrNext->IsLabelInstr() ? instrNext->AsLabelInstr() : instrNext->m_prev->AsLabelInstr();
            instrNext = PeepCondMove(peepCondMoveLabel, instrNext, isInHelper && peepCondMoveLabel->isOpHelper);
#endif

            break;
        }

        case IR::InstrKindBranch:
        {
            if (!peepsEnabled || instr->m_opcode == Js::OpCode::Leave)
            {
                break;
            }

            IR::BranchInstr *branchInstr = instr->AsBranchInstr();
            IR::LabelInstr* target = branchInstr->GetTarget();

            // Don't remove any branches to the generator's epilogue
            if (target != nullptr && target->IsGeneratorEpilogueLabel())
            {
                break;
            }

            instrNext = Peeps::PeepBranch(branchInstr);
#if defined(_M_IX86) || defined(_M_X64)
            Assert(instrNext && instrNext->m_prev);
            if (instrNext->m_prev->IsBranchInstr())
            {
                instrNext = this->HoistSameInstructionAboveSplit(instrNext->m_prev->AsBranchInstr(), instrNext);
            }

#endif
            break;
        }
        case IR::InstrKindPragma:
            if (instr->m_opcode == Js::OpCode::Nop)
            {
                instr->Remove();
            }
            break;

        default:
            if (LowererMD::IsAssign(instr))
            {
                if (!peepsEnabled)
                {
                    break;
                }
                // Cleanup spill code
                instrNext = this->PeepAssign(instr);
            }
            else if (instr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn
                || instr->m_opcode == Js::OpCode::StartCall
                || instr->m_opcode == Js::OpCode::LoweredStartCall)
            {
                // ArgOut/StartCall are normally lowered by the lowering of the associated call instr.
                // If the call becomes unreachable, we could end up with an orphan ArgOut or StartCall.
                // Just delete these StartCalls
                instr->Remove();
            }
#if defined(_M_IX86) || defined(_M_X64)
            else if (instr->m_opcode == Js::OpCode::MOVSD_ZERO)
            {
                this->peepsMD.PeepAssign(instr);
                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
            }
            else if ( (instr->m_opcode == Js::OpCode::INC ) || (instr->m_opcode == Js::OpCode::DEC) )
            {
                // Check for any of the following patterns which can cause partial flag dependency
                //
                //                                                        Jcc or SHL or SHR or SAR or SHLD(in case of x64)
                // Jcc or SHL or SHR or SAR or SHLD(in case of x64)       Any Instruction
                // INC or DEC                                             INC or DEC
                // -------------------------------------------------- OR -----------------------
                // INC or DEC                                             INC or DEC
                // Jcc or SHL or SHR or SAR or SHLD(in case of x64)       Any Instruction
                //                                                        Jcc or SHL or SHR or SAR or SHLD(in case of x64)
                //
                // With this optimization if any of the above pattern found, substitute INC/DEC with ADD/SUB respectively.
                if (!peepsEnabled)
                {
                    break;
                }

                if (AutoSystemInfo::Data.IsAtomPlatform() || PHASE_FORCE(Js::AtomPhase, this->func))
                {
                    bool pattern_found=false;

                    if ( !(instr->IsEntryInstr()) )
                    {
                        IR::Instr *prevInstr = instr->GetPrevRealInstr();
                        if ( IsJccOrShiftInstr(prevInstr)  )
                        {
                            pattern_found = true;
                        }
                        else if ( !(prevInstr->IsEntryInstr()) && IsJccOrShiftInstr(prevInstr->GetPrevRealInstr()) )
                        {
                            pattern_found=true;
                        }
                    }

                    if ( !pattern_found && !(instr->IsExitInstr()) )
                    {
                        IR::Instr *nextInstr = instr->GetNextRealInstr();
                        if ( IsJccOrShiftInstr(nextInstr) )
                        {
                            pattern_found = true;
                        }
                        else if ( !(nextInstr->IsExitInstr() ) && (IsJccOrShiftInstr(nextInstr->GetNextRealInstr())) )
                        {
                            pattern_found = true;
                        }
                    }

                    if (pattern_found)
                    {
                        IR::IntConstOpnd* constOne  = IR::IntConstOpnd::New((IntConstType) 1, instr->GetDst()->GetType(), instr->m_func);
                        IR::Instr * addOrSubInstr = IR::Instr::New(Js::OpCode::ADD, instr->GetDst(), instr->GetDst(), constOne, instr->m_func);

                        if (instr->m_opcode == Js::OpCode::DEC)
                        {
                            addOrSubInstr->m_opcode = Js::OpCode::SUB;
                        }

                        instr->InsertAfter(addOrSubInstr);
                        instr->Remove();
                        instr = addOrSubInstr;
                    }
                }

                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
            }

#endif
            else
            {
                if (!peepsEnabled)
                {
                    break;
                }
#if defined(_M_IX86) || defined(_M_X64)
               instr = this->PeepRedundant(instr);
#endif

                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
                // Kill callee-saved regs across calls and other implicit regs
                this->peepsMD.ProcessImplicitRegs(instr);

#if defined(_M_IX86) || defined(_M_X64)
                if (instr->m_opcode == Js::OpCode::TEST && instr->GetSrc2()->IsIntConstOpnd()
                    && ((instr->GetSrc2()->AsIntConstOpnd()->GetValue() & 0xFFFFFF00) == 0)
                    && instr->GetSrc1()->IsRegOpnd() && (LinearScan::GetRegAttribs(instr->GetSrc1()->AsRegOpnd()->GetReg()) & RA_BYTEABLE))
                {
                    // Only support if the branch is JEQ or JNE to ensure we don't look at the sign flag
                    if (instrNext->IsBranchInstr() &&
                        (instrNext->m_opcode == Js::OpCode::JNE || instrNext->m_opcode == Js::OpCode::JEQ))
                    {
                        instr->GetSrc1()->SetType(TyInt8);
                        instr->GetSrc2()->SetType(TyInt8);
                    }
                }

                if (instr->m_opcode == Js::OpCode::CVTSI2SD)
                {
                    IR::Instr *xorps = IR::Instr::New(Js::OpCode::XORPS, instr->GetDst(), instr->GetDst(), instr->GetDst(), instr->m_func);
                    instr->InsertBefore(xorps);
                }
#endif
            }
        }
    }